

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qiodevice.cpp
# Opt level: O0

void __thiscall QIODevice::setOpenMode(QIODevice *this,OpenMode openMode)

{
  bool bVar1;
  QIODevicePrivate *pQVar2;
  int *piVar3;
  Int in_ESI;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  QIODevicePrivate *d;
  QIODevicePrivate *pQVar4;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int iVar5;
  int iVar6;
  int local_14 [3];
  long local_8;
  
  iVar6 = (int)((ulong)in_RDI >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_14[2] = in_ESI;
  pQVar2 = d_func((QIODevice *)0x2c221e);
  (pQVar2->openMode).super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
  super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i = local_14[2];
  pQVar2->accessMode = Unset;
  pQVar4 = pQVar2;
  bVar1 = isReadable((QIODevice *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  if (bVar1) {
    local_14[1] = 1;
    piVar3 = qMax<int>(&pQVar2->readChannelCount,local_14 + 1);
    iVar5 = *piVar3;
  }
  else {
    iVar5 = 0;
  }
  QIODevicePrivate::setReadChannelCount(pQVar4,iVar6);
  pQVar4 = pQVar2;
  bVar1 = isWritable((QIODevice *)CONCAT44(iVar5,in_stack_ffffffffffffffc0));
  iVar6 = (int)((ulong)pQVar4 >> 0x20);
  if (bVar1) {
    local_14[0] = 1;
    qMax<int>(&pQVar2->writeChannelCount,local_14);
  }
  QIODevicePrivate::setWriteChannelCount
            ((QIODevicePrivate *)CONCAT44(iVar5,in_stack_ffffffffffffffc0),iVar6);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QIODevice::setOpenMode(QIODeviceBase::OpenMode openMode)
{
    Q_D(QIODevice);
#if defined QIODEVICE_DEBUG
    printf("%p QIODevice::setOpenMode(0x%x)\n", this, openMode.toInt());
#endif
    d->openMode = openMode;
    d->accessMode = QIODevicePrivate::Unset;
    d->setReadChannelCount(isReadable() ? qMax(d->readChannelCount, 1) : 0);
    d->setWriteChannelCount(isWritable() ? qMax(d->writeChannelCount, 1) : 0);
}